

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O2

bool v_scroll_on_left_form_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_30;
  Am_Value value;
  Am_Value local_18;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)R5);
  Am_Object::Am_Object(&local_30,pAVar2);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x169);
  Am_Value::operator=(&value,pAVar2);
  Am_Object::~Am_Object(&local_30);
  Am_Value::Am_Value(&local_18,&value);
  bVar1 = find_in_list(&local_18,0xc);
  Am_Value::~Am_Value(&local_18);
  Am_Value::~Am_Value(&value);
  return bVar1;
}

Assistant:

Am_Define_No_Self_Formula(bool, on_left_form)
{
  Am_Value value;
  // get the value from the checkbox widget's value.
  value = checkboxes.Peek(Am_VALUE);
  return !find_in_list(value, ON_RIGHT);
}